

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O1

void __thiscall SerialTaskRunner::ProcessQueue(SerialTaskRunner *this)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  function<void_()> callback;
  RAIICallbacksRunning raiicallbacksrunning;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_30._M_device = &(this->m_callbacks_mutex).super_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  if (this->m_are_callbacks_running == false) {
    if ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
        *(undefined1 **)&this->m_callbacks_pending == &this->m_callbacks_pending) goto LAB_003942c8;
    this->m_are_callbacks_running = true;
    std::function<void_()>::operator=
              ((function<void_()> *)&local_58,
               (function<void_()> *)(*(undefined1 **)&this->m_callbacks_pending + 0x10));
    std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::_M_erase
              (&this->m_callbacks_pending,*(_List_node_base **)&this->m_callbacks_pending);
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
    local_30._M_device = (mutex_type *)this;
    if (local_48 == (code *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        uVar1 = std::__throw_bad_function_call();
        ProcessQueue::RAIICallbacksRunning::~RAIICallbacksRunning((RAIICallbacksRunning *)&local_30)
        ;
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          _Unwind_Resume(uVar1);
        }
      }
      goto LAB_00394371;
    }
    (*pcStack_40)(&local_58);
    ProcessQueue::RAIICallbacksRunning::~RAIICallbacksRunning((RAIICallbacksRunning *)&local_30);
  }
  else {
LAB_003942c8:
    std::unique_lock<std::mutex>::~unique_lock(&local_30);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_00394371:
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::ProcessQueue()
{
    std::function<void()> callback;
    {
        LOCK(m_callbacks_mutex);
        if (m_are_callbacks_running) return;
        if (m_callbacks_pending.empty()) return;
        m_are_callbacks_running = true;

        callback = std::move(m_callbacks_pending.front());
        m_callbacks_pending.pop_front();
    }

    // RAII the setting of fCallbacksRunning and calling MaybeScheduleProcessQueue
    // to ensure both happen safely even if callback() throws.
    struct RAIICallbacksRunning {
        SerialTaskRunner* instance;
        explicit RAIICallbacksRunning(SerialTaskRunner* _instance) : instance(_instance) {}
        ~RAIICallbacksRunning()
        {
            {
                LOCK(instance->m_callbacks_mutex);
                instance->m_are_callbacks_running = false;
            }
            instance->MaybeScheduleProcessQueue();
        }
    } raiicallbacksrunning(this);

    callback();
}